

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_time.c
# Opt level: O3

char * p2sc_timestamp(double t,int prec)

{
  tm *ptVar1;
  char *pcVar2;
  double v;
  time_t s;
  double i;
  long local_30;
  double local_28;
  timeval local_20;
  
  if (t < 0.0) {
    gettimeofday(&local_20,(__timezone_ptr_t)0x0);
    t = (double)local_20.tv_usec / 1000000.0 + (double)local_20.tv_sec;
  }
  v = modf(t,(double *)&local_20);
  local_30 = (long)(double)local_20.tv_sec;
  local_28 = p2sc_round(v,prec);
  if (1.0 <= local_28) {
    local_30 = (long)(double)local_20.tv_sec + 1;
    local_28 = 0.0;
  }
  ptVar1 = gmtime(&local_30);
  if (ptVar1 != (tm *)0x0) {
    pcVar2 = "%04d-%02d-%02dT%02d:%02d:%.3fZ";
    if (local_28 + (double)ptVar1->tm_sec < 10.0) {
      pcVar2 = "%04d-%02d-%02dT%02d:%02d:0%.3fZ";
    }
    pcVar2 = (char *)g_strdup_printf(pcVar2,ptVar1->tm_year + 0x76c,ptVar1->tm_mon + 1,
                                     ptVar1->tm_mday,ptVar1->tm_hour,ptVar1->tm_min);
    return pcVar2;
  }
  _p2sc_msg("p2sc_timestamp",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_time.c"
            ,0x8b,"$Id: p2sc_time.c 5348 2018-04-25 13:55:17Z bogdan $",4000,"gmtime(%f)",
            (double)local_30);
  exit(1);
}

Assistant:

char *p2sc_timestamp(double t, int prec) {
    if (t < 0) {
        struct timeval tv;
        gettimeofday(&tv, NULL);
        t = tv.tv_sec + tv.tv_usec / 1000000.;
        // t = g_get_real_time() / 1000000.; for glib-2.0>=2.28
    }

    double i, f = modf(t, &i);
    time_t s = i;

    f = p2sc_round(f, prec);
    if (f >= 1) {
        ++s;
        f = 0;
    }

    struct tm *tm = gmtime(&s);
    if (!tm)
        P2SC_Msg(LVL_FATAL, "gmtime(%f)", (double) s);

    double tt[6] = {
        tm->tm_year + 1900, tm->tm_mon + 1, tm->tm_mday,
        tm->tm_hour, tm->tm_min, tm->tm_sec + f
    };

    return p2sc_date2string(tt);
}